

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

int av1_receive_compressed_data(AV1Decoder *pbi,size_t size,uint8_t **psource)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  AV1Decoder *pAVar3;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int frame_decoded;
  int i;
  AVxWorkerInterface *winterface;
  RefCntBuffer *ref_buf;
  uint8_t *source;
  AV1_COMMON *cm;
  uint8_t **in_stack_00000060;
  uint8_t *in_stack_00000068;
  uint8_t *in_stack_00000070;
  AV1Decoder *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  AV1Decoder *in_stack_ffffffffffffffc0;
  RefCntBuffer *in_stack_ffffffffffffffc8;
  int local_4;
  
  pAVar3 = (AV1Decoder *)*in_RDX;
  *(undefined4 *)(in_RDI + 0x5ff08) = 0;
  *(undefined4 *)(in_RDI + 0x5ff0c) = 0;
  if ((in_RSI == 0) &&
     (in_stack_ffffffffffffffc8 =
           get_ref_frame_buf((AV1_COMMON *)in_stack_ffffffffffffffc0,
                             (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffbc >> 0x18)),
     in_stack_ffffffffffffffc8 != (RefCntBuffer *)0x0)) {
    (in_stack_ffffffffffffffc8->buf).corrupted = 1;
  }
  iVar4 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pRVar2 = assign_cur_frame_new_fb
                     ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pRVar2 == (RefCntBuffer *)0x0) {
    *(undefined4 *)(in_RDI + 0x5ff08) = 2;
    local_4 = 1;
  }
  else {
    iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x5ffe0));
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x5ffd8) = 1;
      iVar1 = aom_decode_frame_from_obus
                        (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
      if (iVar1 < 0) {
        release_current_frame(in_stack_ffffffffffffffc0);
        *(undefined4 *)(in_RDI + 0x5ffd8) = 0;
        local_4 = 1;
      }
      else {
        update_frame_buffers(pAVar3,iVar4);
        if (iVar1 != 0) {
          *(undefined4 *)(in_RDI + 0x58d80) = 0;
        }
        if (*(int *)(in_RDI + 0x5ff08) == 0) {
          if ((*(int *)(in_RDI + 0x3d48) == 0) && (*(char *)(in_RDI + 0x8598) != '\0')) {
            if ((*(long *)(in_RDI + 0x3c40) == 0) ||
               ((*(int *)(in_RDI + 0x3d74) != *(int *)(*(long *)(in_RDI + 0x3c40) + 0x104) ||
                (*(int *)(in_RDI + 0x3d78) != *(int *)(*(long *)(in_RDI + 0x3c40) + 0x108))))) {
              *(undefined8 *)(in_RDI + 0x8648) = 0;
            }
            else {
              *(undefined8 *)(in_RDI + 0x8648) = *(undefined8 *)(*(long *)(in_RDI + 0x3c40) + 0x50);
            }
          }
          *(undefined4 *)(in_RDI + 0x5ffd8) = 0;
          local_4 = 0;
        }
        else {
          *(undefined4 *)(in_RDI + 0x5ffd8) = 0;
          local_4 = 1;
        }
      }
    }
    else {
      pAVar3 = (AV1Decoder *)aom_get_worker_interface();
      *(undefined4 *)(in_RDI + 0x5ffd8) = 0;
      (**(_func_int_AVxWorker_ptr **)(pAVar3->dcb).xd.plane)((AVxWorker *)(in_RDI + 0x9f00));
      for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0xa128); iVar4 = iVar4 + 1) {
        (**(code **)(pAVar3->dcb).xd.plane)(*(long *)(in_RDI + 0xa120) + (long)iVar4 * 0x38);
      }
      release_current_frame(pAVar3);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int av1_receive_compressed_data(AV1Decoder *pbi, size_t size,
                                const uint8_t **psource) {
  AV1_COMMON *volatile const cm = &pbi->common;
  const uint8_t *source = *psource;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;

  if (size == 0) {
    // This is used to signal that we are missing frames.
    // We do not know if the missing frame(s) was supposed to update
    // any of the reference buffers, but we act conservative and
    // mark only the last buffer as corrupted.
    //
    // TODO(jkoleszar): Error concealment is undefined and non-normative
    // at this point, but if it becomes so, [0] may not always be the correct
    // thing to do here.
    RefCntBuffer *ref_buf = get_ref_frame_buf(cm, LAST_FRAME);
    if (ref_buf != NULL) ref_buf->buf.corrupted = 1;
  }

  if (assign_cur_frame_new_fb(cm) == NULL) {
    pbi->error.error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    const AVxWorkerInterface *const winterface = aom_get_worker_interface();
    int i;

    pbi->error.setjmp = 0;

    // Synchronize all threads immediately as a subsequent decode call may
    // cause a resize invalidating some allocations.
    winterface->sync(&pbi->lf_worker);
    for (i = 0; i < pbi->num_workers; ++i) {
      winterface->sync(&pbi->tile_workers[i]);
    }

    release_current_frame(pbi);
    return -1;
  }

  pbi->error.setjmp = 1;

  int frame_decoded =
      aom_decode_frame_from_obus(pbi, source, source + size, psource);

  if (frame_decoded < 0) {
    assert(pbi->error.error_code != AOM_CODEC_OK);
    release_current_frame(pbi);
    pbi->error.setjmp = 0;
    return 1;
  }

#if TXCOEFF_TIMER
  cm->cum_txcoeff_timer += cm->txcoeff_timer;
  fprintf(stderr,
          "txb coeff block number: %d, frame time: %ld, cum time %ld in us\n",
          cm->txb_count, cm->txcoeff_timer, cm->cum_txcoeff_timer);
  cm->txcoeff_timer = 0;
  cm->txb_count = 0;
#endif

  // Note: At this point, this function holds a reference to cm->cur_frame
  // in the buffer pool. This reference is consumed by update_frame_buffers().
  update_frame_buffers(pbi, frame_decoded);

  if (frame_decoded) {
    pbi->decoding_first_frame = 0;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) {
    pbi->error.setjmp = 0;
    return 1;
  }

  if (!cm->show_existing_frame) {
    if (cm->seg.enabled) {
      if (cm->prev_frame &&
          (cm->mi_params.mi_rows == cm->prev_frame->mi_rows) &&
          (cm->mi_params.mi_cols == cm->prev_frame->mi_cols)) {
        cm->last_frame_seg_map = cm->prev_frame->seg_map;
      } else {
        cm->last_frame_seg_map = NULL;
      }
    }
  }

  // Update progress in frame parallel decode.
  pbi->error.setjmp = 0;

  return 0;
}